

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O3

bool __thiscall
ON_Curve::GetNextDiscontinuity
          (ON_Curve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  ON_3dVector Km;
  ON_3dVector Kp;
  bool bVar1;
  int iVar2;
  double *pdVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  double dVar7;
  ON_Interval domain;
  ON_3dVector Kb;
  ON_3dVector Ka;
  ON_3dVector Ta;
  ON_3dVector D2b;
  ON_3dVector D2a;
  ON_3dVector D1b;
  ON_3dVector D1a;
  ON_3dVector Tb;
  ON_3dPoint Pa;
  double local_158;
  ON_Interval local_150;
  double *local_140;
  double local_138;
  double local_130;
  double local_128;
  ON_3dVector local_120;
  ON_3dVector local_108;
  ON_3dVector local_f0;
  ON_3dVector local_d8;
  ON_3dVector local_c0;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  if (dtype != (int *)0x0) {
    *dtype = 0;
  }
  if ((t0 == t1) && (!NAN(t0) && !NAN(t1))) {
    return false;
  }
  if (4 < c - C0_locus_continuous) {
    return false;
  }
  bVar4 = (byte)(c - C0_locus_continuous);
  bVar6 = 6 >> (bVar4 & 0x1f);
  bVar5 = 0x18 >> (bVar4 & 0x1f);
  dVar7 = t1;
  local_140 = t;
  local_138 = t0;
  local_130 = curvature_tolerance;
  local_128 = cos_angle_tolerance;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(this);
  iVar2 = 1;
  local_150.m_t[1] = dVar7;
  pdVar3 = ON_Interval::operator[](&local_150,1);
  if ((*pdVar3 <= local_138) || (pdVar3 = ON_Interval::operator[](&local_150,1), t1 < *pdVar3)) {
    iVar2 = 0;
    pdVar3 = ON_Interval::operator[](&local_150,0);
    local_158 = t1;
    if ((*pdVar3 <= local_138 && local_138 != *pdVar3) &&
       (pdVar3 = ON_Interval::operator[](&local_150,0), t1 <= *pdVar3)) goto LAB_004249de;
  }
  else {
LAB_004249de:
    pdVar3 = ON_Interval::operator[](&local_150,iVar2);
    local_158 = *pdVar3;
  }
  pdVar3 = ON_Interval::operator[](&local_150,1);
  if ((*pdVar3 <= local_138) ||
     (pdVar3 = ON_Interval::operator[](&local_150,1), local_158 < *pdVar3)) {
    pdVar3 = ON_Interval::operator[](&local_150,0);
    if (local_138 < *pdVar3 || local_138 == *pdVar3) {
      return false;
    }
    pdVar3 = ON_Interval::operator[](&local_150,0);
    if (*pdVar3 < local_158) {
      return false;
    }
  }
  iVar2 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(this);
  if ((char)iVar2 == '\0') {
    if (dtype != (int *)0x0) {
      *dtype = 0;
    }
    goto LAB_00424bdb;
  }
  if (((bVar6 | bVar5) & 1) != 0) {
    pdVar3 = ON_Interval::operator[](&local_150,0);
    bVar1 = Ev2Der(this,*pdVar3,&local_48,&local_90,&local_c0,1,(int *)0x0);
    if (!bVar1) {
      return false;
    }
    pdVar3 = ON_Interval::operator[](&local_150,1);
    bVar1 = Ev2Der(this,*pdVar3,&local_60,&local_a8,&local_d8,-1,(int *)0x0);
    if (!bVar1) {
      return false;
    }
    if ((bVar6 & 1) == 0) {
      if ((bVar5 & 1) != 0) {
        ON_EvCurvature(&local_90,&local_c0,&local_f0,&local_108);
        ON_EvCurvature(&local_a8,&local_d8,&local_78,&local_120);
        dVar7 = ON_3dVector::operator*(&local_f0,&local_78);
        if (dVar7 < local_128) {
          iVar2 = 1;
        }
        else {
          if ((0x10U >> (bVar4 & 0x1f) & 1) == 0) {
            return false;
          }
          Km.y = local_108.y;
          Km.x = local_108.x;
          Km.z = local_108.z;
          Kp.y = local_120.y;
          Kp.x = local_120.x;
          Kp.z = local_120.z;
          bVar1 = ON_IsG2CurvatureContinuous(Km,Kp,local_128,local_130);
          if (bVar1) {
            return false;
          }
          iVar2 = 2;
        }
        if (dtype != (int *)0x0) {
          *dtype = iVar2;
        }
        goto LAB_00424bdb;
      }
    }
    else {
      ON_3dVector::operator-(&local_f0,&local_90,&local_a8);
      dVar7 = ON_3dVector::MaximumCoordinate(&local_a8);
      bVar1 = ON_3dVector::IsTiny(&local_f0,dVar7 * 1.490116119385e-08);
      if (!bVar1) {
        if (dtype != (int *)0x0) {
          *dtype = 1;
        }
LAB_00424bdb:
        *local_140 = local_158;
        return true;
      }
      if ((4U >> (bVar4 & 0x1f) & 1) != 0) {
        ON_3dVector::operator-(&local_f0,&local_c0,&local_d8);
        dVar7 = ON_3dVector::MaximumCoordinate(&local_d8);
        bVar1 = ON_3dVector::IsTiny(&local_f0,dVar7 * 1.490116119385e-08);
        if (!bVar1) {
          if (dtype != (int *)0x0) {
            *dtype = 2;
          }
          goto LAB_00424bdb;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Curve::GetNextDiscontinuity( 
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  // this function must be overridden by curve objects that
  // can have parametric discontinuities on the interior of the curve.

  bool rc = false;

  if ( dtype )
    *dtype = 0;
  
  if ( t0 != t1 )
  {
    bool bTestC0 = false;
    bool bTestD1 = false;
    bool bTestD2 = false;
    bool bTestT = false;
    bool bTestK = false;
    switch(c)
    {
    case ON::continuity::C0_locus_continuous:
      bTestC0 = true;
      break;
    case ON::continuity::C1_locus_continuous:
      bTestC0 = true;
      bTestD1 = true;
      break;
    case ON::continuity::C2_locus_continuous:
      bTestC0 = true;
      bTestD1 = true;
      bTestD2 = true;
      break;
    case ON::continuity::G1_locus_continuous:
      bTestC0 = true;
      bTestT  = true;
      break;
    case ON::continuity::G2_locus_continuous:
      bTestC0 = true;
      bTestT  = true;
      bTestK  = true;
      break;
    default:
      // other values ignored on purpose.
      break;
    }

    if ( bTestC0 )
    {
      // 20 March 2003 Dale Lear:
      //   Have to look for locus discontinuities at ends.
      //   Must test both ends because t0 > t1 is valid input.
      //   In particular, for ON_CurveProxy::GetNextDiscontinuity() 
      //   to work correctly on reversed "real" curves, the 
      //   t0 > t1 must work right.
      ON_Interval domain = Domain();

      if ( t0 < domain[1] && t1 >= domain[1] )
        t1 = domain[1];
      else if ( t0 > domain[0] && t1 <= domain[0] )
        t1 = domain[0];

      if ( (t0 < domain[1] && t1 >= domain[1]) || (t0 > domain[0] && t1 <= domain[0]) )
      {
        if ( IsClosed() )
        {
          if ( bTestD1 || bTestT )
          {
            // need to check locus continuity at start/end of closed curve.
            ON_3dPoint Pa, Pb;
            ON_3dVector D1a, D1b, D2a, D2b;
            if (    Ev2Der(domain[0],Pa,D1a,D2a,1,nullptr) 
                 && Ev2Der(domain[1],Pb,D1b,D2b,-1,nullptr) )
            {
              Pb = Pa; // IsClosed() = true means assume Pa=Pb;
              if ( bTestD1 )
              {
                if ( !(D1a-D1b).IsTiny(D1b.MaximumCoordinate()*ON_SQRT_EPSILON ) )
                {
                  if ( dtype )
                    *dtype = 1;
                  *t = t1;
                  rc = true;
                }
                else if ( bTestD2 && !(D2a-D2b).IsTiny(D2b.MaximumCoordinate()*ON_SQRT_EPSILON) )
                {
                  if ( dtype )
                    *dtype = 2;
                  *t = t1;
                  rc = true;
                }

              }
              else if ( bTestT )
              {
                ON_3dVector Ta, Tb, Ka, Kb;
                ON_EvCurvature( D1a, D2a, Ta, Ka );
                ON_EvCurvature( D1b, D2b, Tb, Kb );
                if ( Ta*Tb < cos_angle_tolerance )
                {
                  if ( dtype )
                    *dtype = 1;
                  *t = t1;
                  rc = true;
                }
                else if ( bTestK )
                {
                  // NOTE: 
                  //  This test must exactly match the one
                  //  used in ON_NurbsCurve::GetNextDiscontinuity()
                  if ( !ON_IsG2CurvatureContinuous( Ka, Kb,
                                                    cos_angle_tolerance,
                                                    curvature_tolerance
                                                    )
                     )
                  {
                    if ( dtype )
                      *dtype = 2;
                    *t = t1;
                    rc = true;
                  }
                }
              }
            }
          }
        }
        else
        {
          // open curves are not locus continuous at ends.
          if (dtype )
            *dtype = 0; // locus C0 discontinuity
          *t = t1;
          rc = true;
        }
      }
    }
  }

  return rc;
}